

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,bool_const&>
               (string *s,char *fmt,SpectrumTextureHandle *v,FloatTextureHandle *args,
               FloatTextureHandle *args_1,bool *args_2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  string *in_RCX;
  string *in_RDI;
  char *in_R8;
  FloatTextureHandle *in_R9;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  SpectrumTextureHandle *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdc0;
  char **in_stack_fffffffffffffdc8;
  char **in_stack_fffffffffffffdd0;
  SpectrumTextureHandle *in_stack_fffffffffffffdd8;
  ostream *in_stack_fffffffffffffde0;
  string local_210 [32];
  stringstream local_1f0 [40];
  char *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  LogLevel in_stack_fffffffffffffe54;
  string local_50 [16];
  bool *in_stack_ffffffffffffffc0;
  FloatTextureHandle *in_stack_ffffffffffffffc8;
  
  copyToFormatString(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  lVar1 = std::__cxx11::string::find((char)local_50,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_50,0x73);
  lVar3 = std::__cxx11::string::find((char)local_50,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
             in_stack_fffffffffffffe38);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
             in_stack_fffffffffffffe38);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
               in_stack_fffffffffffffe38);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::SpectrumTextureHandle_const&>
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffda8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1f0);
    pbrt::operator<<(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::operator+=(in_RDI,local_210);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
    std::__cxx11::stringstream::~stringstream(local_1f0);
  }
  stringPrintfRecursive<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,bool_const&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}